

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int *piVar2;
  Lexer *lexer;
  Parser *parser;
  Tree *pTVar3;
  
  log_level_ = 0xf;
  signal(0xb,handler);
  signal(6,handler);
  signal(8,handler);
  iVar1 = _setjmp((__jmp_buf_tag *)buf);
  if (iVar1 == 0) {
    lexer = new_lexer(argv[1]);
    parser = new_parser(lexer);
    pTVar3 = parse(parser);
    (*(pTVar3->node).eval)((Env *)0x0,parser->tree);
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 4) {
      log_error(anon_var_dwarf_27);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    level = LOG_LEVEL_DEBUG;
    signal(SIGSEGV, handler);
    signal(SIGABRT, handler);
    signal(SIGFPE, handler);
    try(buf) {
        Lexer *lexer = new_lexer(argv[1]);
        Parser *parser = new_parser(lexer);
        tree_node(parse(parser))->eval(NULL, parser->tree);
    } catch(4) {
        log_error("遇到错误!!");
    }
    return 0;
}